

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

vector3 * vector3_reflect_by_quaternion(vector3 *self,quaternion *qT)

{
  anon_union_32_3_07544b10_for_quaternion_0 local_38;
  
  local_38.q[0] = (qT->field_0).q[0];
  local_38.q[1] = (qT->field_0).q[1];
  local_38.q[2] = (qT->field_0).q[2];
  local_38.q[3] = (qT->field_0).q[3];
  quaternion_multiplyv3((quaternion *)&local_38.field_1,self);
  quaternion_multiply((quaternion *)&local_38.field_1,qT);
  quaternion_normalize((quaternion *)&local_38.field_1);
  (self->field_0).v[0] = local_38.q[0];
  (self->field_0).v[1] = local_38.q[1];
  (self->field_0).v[2] = local_38.q[2];
  return self;
}

Assistant:

HYPAPI struct vector3 *vector3_reflect_by_quaternion(struct vector3 *self, const struct quaternion *qT)
{
	struct quaternion q;

	quaternion_set(&q, qT);
	quaternion_multiplyv3(&q, self);
	quaternion_multiply(&q, qT);

	/* this seems to be necessary */
	quaternion_normalize(&q);

	self->x = q.x;
	self->y = q.y;
	self->z = q.z;

	return self;
}